

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::XML_CheckNode_SkipUnsupported(AMFImporter *this,string *pParentNodeName)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DeadlyImportError *this_00;
  Logger *this_01;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *this_02;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_120;
  undefined1 local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ulong local_78;
  size_t sk_idx;
  bool close_found;
  bool found;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string nn;
  char *Uns_Skip [3];
  string *pParentNodeName_local;
  AMFImporter *this_local;
  
  nn.field_2._8_4_ = 0xbb18d6;
  nn.field_2._12_4_ = 0;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,(char *)CONCAT44(extraout_var,iVar2),&local_59);
  std::allocator<char>::~allocator(&local_59);
  sk_idx._3_1_ = 0;
  sk_idx._2_1_ = 0;
  local_78 = 0;
  do {
    if (2 < local_78) {
LAB_005dcad1:
      if ((sk_idx._3_1_ & 1) != 0) {
        if ((sk_idx._2_1_ & 1) == 0) {
          Throw_CloseNotFound(this,(string *)local_58);
        }
        if ((XML_CheckNode_SkipUnsupported::skipped_before[local_78] & 1U) == 0) {
          XML_CheckNode_SkipUnsupported::skipped_before[local_78] = true;
          this_01 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[16]>(&local_298,(char (*) [16])"Skipping node \"");
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_298,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_58);
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar4,(char (*) [6])"\" in ");
          pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar4,pParentNodeName);
          this_02 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_(pbVar4,(char (*) [2])0xbb58f9);
          Formatter::basic_formatter::operator_cast_to_string(&local_120,this_02);
          Logger::warn(this_01,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_298);
        }
        std::__cxx11::string::~string((string *)local_58);
        return;
      }
      local_f9 = 1;
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+(&local_f8,"Unknown node \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::operator+(&local_d8,&local_f8,"\" in ");
      std::operator+(&local_b8,&local_d8,pParentNodeName);
      std::operator+(&local_98,&local_b8,".");
      DeadlyImportError::DeadlyImportError(this_00,&local_98);
      local_f9 = 0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,Uns_Skip[local_78 - 1]);
    if (!bVar1) {
      sk_idx._3_1_ = 1;
      uVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
      if ((uVar3 & 1) != 0) {
        sk_idx._2_1_ = 1;
        goto LAB_005dcad1;
      }
      while (uVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (uVar3 & 1) != 0) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 == 2) {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_58,(char *)CONCAT44(extraout_var_00,iVar2));
          if (bVar1) {
            sk_idx._2_1_ = 1;
            goto LAB_005dcad1;
          }
        }
      }
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

void AMFImporter::XML_CheckNode_SkipUnsupported(const std::string& pParentNodeName)
{
    static const size_t Uns_Skip_Len = 3;
    const char* Uns_Skip[Uns_Skip_Len] = { "composite", "edge", "normal" };

    static bool skipped_before[Uns_Skip_Len] = { false, false, false };

    std::string nn(mReader->getNodeName());
    bool found = false;
    bool close_found = false;
    size_t sk_idx;

	for(sk_idx = 0; sk_idx < Uns_Skip_Len; sk_idx++)
	{
		if(nn != Uns_Skip[sk_idx]) continue;

		found = true;
		if(mReader->isEmptyElement())
		{
			close_found = true;

			goto casu_cres;
		}

		while(mReader->read())
		{
			if((mReader->getNodeType() == irr::io::EXN_ELEMENT_END) && (nn == mReader->getNodeName()))
			{
				close_found = true;

				goto casu_cres;
			}
		}
	}// for(sk_idx = 0; sk_idx < Uns_Skip_Len; sk_idx++)

casu_cres:

	if(!found) throw DeadlyImportError("Unknown node \"" + nn + "\" in " + pParentNodeName + ".");
	if(!close_found) Throw_CloseNotFound(nn);

	if(!skipped_before[sk_idx])
	{
		skipped_before[sk_idx] = true;
        ASSIMP_LOG_WARN_F("Skipping node \"", nn, "\" in ", pParentNodeName, ".");
	}
}